

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O2

int dlep_writer_map_l2neigh_data
              (dlep_writer *writer,dlep_extension *ext,oonf_layer2_data *data,oonf_layer2_data *def)

{
  oonf_layer2_data *poVar1;
  uint uVar2;
  dlep_neighbor_mapping *pdVar3;
  code *pcVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  oonf_layer2_data *poVar8;
  long lVar9;
  bool bVar10;
  
  lVar9 = 0;
  uVar7 = 0;
  while( true ) {
    if (ext->neigh_mapping_count <= uVar7) {
      return 0;
    }
    pdVar3 = ext->neigh_mapping;
    uVar2 = *(uint *)((long)&pdVar3->layer2 + lVar9);
    poVar1 = data + uVar2;
    if (data[uVar2]._origin == (oonf_layer2_origin *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = poVar1->_meta != (oonf_layer2_metadata *)0x0;
    }
    poVar8 = poVar1;
    if (!bVar10) {
      poVar8 = def + uVar2;
    }
    if (def == (oonf_layer2_data *)0x0) {
      poVar8 = poVar1;
    }
    pcVar4 = *(code **)((long)&pdVar3->to_tlv + lVar9);
    uVar6 = oonf_layer2_neigh_metadata_get();
    iVar5 = (*pcVar4)(writer,poVar8,uVar6,*(undefined2 *)((long)&pdVar3->dlep + lVar9),
                      *(undefined2 *)((long)&pdVar3->length + lVar9),
                      *(undefined8 *)((long)&pdVar3->scaling + lVar9));
    if (iVar5 != 0) break;
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 0x40;
  }
  return ~(uint)uVar7;
}

Assistant:

int
dlep_writer_map_l2neigh_data(
  struct dlep_writer *writer, struct dlep_extension *ext, struct oonf_layer2_data *data, struct oonf_layer2_data *def) {
  struct dlep_neighbor_mapping *map;
  struct oonf_layer2_data *ptr;
  size_t i;

  for (i = 0; i < ext->neigh_mapping_count; i++) {
    map = &ext->neigh_mapping[i];

    ptr = &data[map->layer2];
    if (!oonf_layer2_data_has_value(ptr) && def) {
      ptr = &def[map->layer2];
    }

    if (map->to_tlv(writer, ptr, oonf_layer2_neigh_metadata_get(map->layer2), map->dlep, map->length, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}